

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DramAnalyzer.cpp
# Opt level: O2

void __thiscall DramAnalyzer::DramAnalyzer(DramAnalyzer *this,char *target)

{
  vector<std::vector<volatile_char_*,_std::allocator<volatile_char_*>_>,_std::allocator<std::vector<volatile_char_*,_std::allocator<volatile_char_*>_>_>_>
  *this_00;
  uint uVar1;
  undefined1 local_2758 [8];
  random_device rd;
  _Vector_base<volatile_char_*,_std::allocator<volatile_char_*>_> local_48;
  allocator_type local_21;
  
  (this->bank_rank_functions).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->bank_rank_functions).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->row_function = 0;
  (this->banks).
  super__Vector_base<std::vector<volatile_char_*,_std::allocator<volatile_char_*>_>,_std::allocator<std::vector<volatile_char_*,_std::allocator<volatile_char_*>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->bank_rank_functions).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->banks).
  super__Vector_base<std::vector<volatile_char_*,_std::allocator<volatile_char_*>_>,_std::allocator<std::vector<volatile_char_*,_std::allocator<volatile_char_*>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->banks).
  super__Vector_base<std::vector<volatile_char_*,_std::allocator<volatile_char_*>_>,_std::allocator<std::vector<volatile_char_*,_std::allocator<volatile_char_*>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  this->start_address = target;
  std::
  mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
  ::mersenne_twister_engine(&this->gen);
  (this->dist)._M_param = (param_type)0x7fffffff00000000;
  std::random_device::random_device((random_device *)local_2758);
  uVar1 = std::random_device::_M_getval();
  std::
  mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
  ::seed((mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          *)((long)&rd.field_0 + 0x1380),(ulong)uVar1);
  memcpy(&this->gen,(void *)((long)&rd.field_0 + 0x1380),5000);
  (this->dist)._M_param = (param_type)0x7fffffff00000000;
  local_48._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_48._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_48._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  vector<std::vector<volatile_char_*,_std::allocator<volatile_char_*>_>,_std::allocator<std::vector<volatile_char_*,_std::allocator<volatile_char_*>_>_>_>
  ::vector((vector<std::vector<volatile_char_*,_std::allocator<volatile_char_*>_>,_std::allocator<std::vector<volatile_char_*,_std::allocator<volatile_char_*>_>_>_>
            *)((long)&rd.field_0 + 0x1380),0x10,(value_type *)&local_48,&local_21);
  this_00 = (vector<std::vector<volatile_char_*,_std::allocator<volatile_char_*>_>,_std::allocator<std::vector<volatile_char_*,_std::allocator<volatile_char_*>_>_>_>
             *)((long)&rd.field_0 + 0x1380);
  std::
  vector<std::vector<volatile_char_*,_std::allocator<volatile_char_*>_>,_std::allocator<std::vector<volatile_char_*,_std::allocator<volatile_char_*>_>_>_>
  ::_M_move_assign(&this->banks,this_00);
  std::
  vector<std::vector<volatile_char_*,_std::allocator<volatile_char_*>_>,_std::allocator<std::vector<volatile_char_*,_std::allocator<volatile_char_*>_>_>_>
  ::~vector(this_00);
  std::_Vector_base<volatile_char_*,_std::allocator<volatile_char_*>_>::~_Vector_base(&local_48);
  std::random_device::~random_device((random_device *)local_2758);
  return;
}

Assistant:

DramAnalyzer::DramAnalyzer(volatile char *target) :
  row_function(0), start_address(target) {
  std::random_device rd;
  gen = std::mt19937(rd());
  dist = std::uniform_int_distribution<>(0, std::numeric_limits<int>::max());
  banks = std::vector<std::vector<volatile char *>>(NUM_BANKS, std::vector<volatile char *>());
}